

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeLoadDoubleFromPointer
               (CodeGenRegVmContext *ctx,x86Reg tempReg,x86XmmReg targetReg,uchar reg,uint offset)

{
  if ((byte)(reg - 1) < 3) {
    tempReg = (&UINT_001e8b50)[(byte)(reg - 1)];
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,tempReg,sQWORD,rEBX,(uint)reg << 3);
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,targetReg,sQWORD,tempReg,offset);
  return;
}

Assistant:

void GenCodeLoadDoubleFromPointer(CodeGenRegVmContext &ctx, x86Reg tempReg, x86XmmReg targetReg, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rREG, offset); // Load double value
	}
	else if(reg == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rR15, offset); // Load double value
	}
	else if(reg == rvrrConstants)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rR14, offset); // Load double value
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, tempReg, sQWORD, rREG, reg * 8); // Load source pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, tempReg, offset); // Load double value
	}
}